

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidy.c
# Opt level: O3

void tidyPrintTidyLanguageNames(ctmbstr format)

{
  ctmbstr __s;
  TidyIterator i;
  TidyIterator local_18;
  
  local_18 = getInstalledLanguageList();
  while (local_18 != (TidyIterator)0x0) {
    __s = getNextInstalledLanguage(&local_18);
    if (format == (ctmbstr)0x0) {
      puts(__s);
    }
    else {
      printf(format,__s);
    }
  }
  return;
}

Assistant:

void tidyPrintTidyLanguageNames( ctmbstr format )
{
    ctmbstr item;
    TidyIterator i = getInstalledLanguageList();

    while (i) {
        item = getNextInstalledLanguage(&i);
        if ( format )
            printf( format, item );
        else
            printf( "%s\n", item );
    }
}